

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O1

void __thiscall Assimp::FlipUVsProcess::Execute(FlipUVsProcess *this,aiScene *pScene)

{
  Logger *pLVar1;
  ulong uVar2;
  
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"FlipUVsProcess begin");
  if (pScene->mNumMeshes != 0) {
    uVar2 = 0;
    do {
      ProcessMesh((FlipUVsProcess *)pLVar1,pScene->mMeshes[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < pScene->mNumMeshes);
  }
  if (pScene->mNumMaterials != 0) {
    uVar2 = 0;
    do {
      ProcessMaterial((FlipUVsProcess *)pLVar1,pScene->mMaterials[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < pScene->mNumMaterials);
  }
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"FlipUVsProcess finished");
  return;
}

Assistant:

void FlipUVsProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("FlipUVsProcess begin");
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        ProcessMesh(pScene->mMeshes[i]);

    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
        ProcessMaterial(pScene->mMaterials[i]);
    ASSIMP_LOG_DEBUG("FlipUVsProcess finished");
}